

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O3

void __thiscall MmapReader::grow(MmapReader *this,size_t n)

{
  bool bVar1;
  void *__shmaddr;
  size_t sVar2;
  size_t sVar3;
  size_t __len;
  int iVar4;
  undefined4 extraout_var;
  uint8_t *__dest;
  int *piVar5;
  interprocess_exception *this_00;
  long lVar6;
  error_info local_20;
  
  iVar4 = (*(this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter[6])();
  __len = CONCAT44(extraout_var,iVar4) * 2;
  __dest = (uint8_t *)mmap((void *)0x0,__len,3,0x21,-1,0);
  if (__dest != (uint8_t *)0xffffffffffffffff) {
    memcpy(__dest,(this->_region).m_base,(this->_region).m_size);
    __shmaddr = (this->_region).m_base;
    sVar2 = (this->_region).m_size;
    (this->_region).m_base = __dest;
    (this->_region).m_size = __len;
    sVar3 = (this->_region).m_page_offset;
    (this->_region).m_page_offset = 0;
    (this->_region).m_mode = read_only;
    bVar1 = (this->_region).m_is_xsi;
    (this->_region).m_is_xsi = false;
    (this->super_MemoryReader)._mem = __dest;
    (this->super_MemoryReader)._size = __len;
    if (__shmaddr != (void *)0x0) {
      if (bVar1 == false) {
        munmap((void *)((long)__shmaddr - sVar3),sVar2 + sVar3);
        return;
      }
      iVar4 = shmdt(__shmaddr);
      if (iVar4 != 0) {
        __assert_fail("ret == 0","/usr/include/boost/interprocess/mapped_region.hpp",0x344,
                      "void boost::interprocess::mapped_region::priv_close()");
      }
    }
    return;
  }
  piVar5 = __errno_location();
  local_20.m_nat = *piVar5;
  lVar6 = 0;
  do {
    if (*(int *)((long)&boost::interprocess::ec_table + lVar6) == local_20.m_nat) {
      local_20.m_ec = *(error_code_t *)(&UNK_001310b4 + lVar6);
      goto LAB_0011771a;
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x80);
  local_20.m_ec = system_error;
LAB_0011771a:
  this_00 = (interprocess_exception *)__cxa_allocate_exception(0x30);
  boost::interprocess::interprocess_exception::interprocess_exception(this_00,&local_20,(char *)0x0)
  ;
  __cxa_throw(this_00,&boost::interprocess::interprocess_exception::typeinfo,
              boost::interprocess::interprocess_exception::~interprocess_exception);
}

Assistant:

virtual void grow(size_t n)
    {
        ipc::mapped_region newregion(ipc::anonymous_shared_memory(size()*2));
        memcpy(newregion.get_address(), _region.get_address(), _region.get_size());

        _region.swap(newregion);
        setbuf((uint8_t*)_region.get_address(), _region.get_size());
    }